

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O3

void __thiscall icu_63::CalendarAstronomer::CalendarAstronomer(CalendarAstronomer *this)

{
  UDate UVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined4 uVar7;
  undefined4 uVar8;
  
  UVar1 = Calendar::getNow();
  this->fTime = UVar1;
  this->fLongitude = 0.0;
  this->fLatitude = 0.0;
  this->fGmtOffset = 0.0;
  (this->moonPosition).ascension = 0.0;
  (this->moonPosition).declination = 0.0;
  this->moonPositionSet = '\0';
  dVar2 = uprv_getNaN_63();
  uVar7 = SUB84(dVar2,0);
  uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
  auVar3._8_4_ = uVar7;
  auVar3._0_8_ = dVar2;
  auVar3._12_4_ = uVar8;
  this->sunLongitude = dVar2;
  this->meanAnomalySun = (double)auVar3._8_8_;
  auVar4._8_4_ = uVar7;
  auVar4._0_8_ = dVar2;
  auVar4._12_4_ = uVar8;
  this->julianDay = dVar2;
  this->julianCentury = (double)auVar4._8_8_;
  auVar5._8_4_ = uVar7;
  auVar5._0_8_ = dVar2;
  auVar5._12_4_ = uVar8;
  this->meanAnomalyMoon = dVar2;
  this->eclipObliquity = (double)auVar5._8_8_;
  auVar6._8_4_ = uVar7;
  auVar6._0_8_ = dVar2;
  auVar6._12_4_ = uVar8;
  this->moonLongitude = dVar2;
  this->moonEclipLong = (double)auVar6._8_8_;
  this->siderealTime = dVar2;
  this->siderealT0 = dVar2;
  this->moonPositionSet = '\0';
  return;
}

Assistant:

CalendarAstronomer::CalendarAstronomer():
  fTime(Calendar::getNow()), fLongitude(0.0), fLatitude(0.0), fGmtOffset(0.0), moonPosition(0,0), moonPositionSet(FALSE) {
  clearCache();
}